

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_set.cpp
# Opt level: O3

void __thiscall
GIM_BOX_TREE::build_tree(GIM_BOX_TREE *this,gim_array<GIM_AABB_DATA> *primitive_boxes)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  *(undefined4 *)this = 0;
  uVar2 = *(uint *)(this + 0x10);
  uVar6 = (ulong)uVar2;
  uVar5 = *(int *)(primitive_boxes + 8) * 2;
  if (uVar2 < uVar5) {
    if (*(uint *)(this + 0x14) < uVar5) {
      if (uVar2 == 0) {
        pvVar7 = gim_alloc((ulong)uVar5 * 0x30);
      }
      else {
        pvVar7 = gim_realloc(*(void **)(this + 8),uVar6 * 0x30,(ulong)uVar5 * 0x30);
      }
      *(void **)(this + 8) = pvVar7;
      *(uint *)(this + 0x14) = uVar5;
      uVar6 = (ulong)*(uint *)(this + 0x10);
    }
    while ((uint)uVar6 < uVar5) {
      lVar4 = *(long *)(this + 8);
      puVar1 = (undefined8 *)(lVar4 + 0x10 + uVar6 * 0x30);
      *puVar1 = uStack_38;
      puVar1[1] = uStack_30;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1 = (undefined8 *)(lVar4 + uVar6 * 0x30);
      *puVar1 = local_48;
      puVar1[1] = uStack_40;
      puVar1[2] = uStack_38;
      puVar1[3] = uStack_30;
      iVar3 = *(int *)(this + 0x10);
      *(uint *)(this + 0x10) = iVar3 + 1U;
      uVar6 = (ulong)(iVar3 + 1U);
    }
  }
  else if (uVar5 < uVar2) {
    *(uint *)(this + 0x10) = uVar5;
  }
  _build_sub_tree(this,primitive_boxes,0,*(uint *)(primitive_boxes + 8));
  return;
}

Assistant:

void GIM_BOX_TREE::build_tree(
	gim_array<GIM_AABB_DATA>& primitive_boxes)
{
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}